

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mulmod.c
# Opt level: O0

int main(void)

{
  uint64_t uVar1;
  uint64_t unaff_retaddr;
  uint64_t in_stack_00000008;
  uint64_t in_stack_00000010;
  int local_4;
  
  uVar1 = mulmod(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (((uVar1 == 4) &&
      (uVar1 = mulmod(in_stack_00000010,in_stack_00000008,unaff_retaddr), uVar1 == 0x2540be3fd)) &&
     (uVar1 = mulmod(in_stack_00000010,in_stack_00000008,unaff_retaddr), uVar1 == 0x44521)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main() {

    // test with small numbers

    if(mulmod(123, 456, 7) != 4)
        goto error;

    if(mulmod(987654, 54321, 43650352937) != 9999999997)
        goto error;

    // test with 64 bit numbers

    if(mulmod(0xffffffffffffffff, 0xffffffffffffffff, 1152921504606847009) != 279841)
        goto error;

    return 0;


    error:
        return 1;

}